

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O2

void __thiscall cmOrderDirectories::FindConflicts(cmOrderDirectories *this)

{
  pointer puVar1;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *pvVar2;
  uint index;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  __first;
  ConflictList *cl;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *this_00;
  value_type_conflict1 local_1c;
  
  std::vector<cmOrderDirectories::ConflictList,_std::allocator<cmOrderDirectories::ConflictList>_>::
  resize(&this->ConflictGraph,
         (long)(this->OriginalDirectories).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)(this->OriginalDirectories).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start >> 5);
  local_1c = 0;
  std::vector<int,_std::allocator<int>_>::resize
            (&this->DirectoryVisited,
             (long)(this->OriginalDirectories).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->OriginalDirectories).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5,&local_1c);
  index = 0;
  while( true ) {
    puVar1 = (this->ConstraintEntries).
             super__Vector_base<std::unique_ptr<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>,_std::allocator<std::unique_ptr<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->ConstraintEntries).
                      super__Vector_base<std::unique_ptr<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>,_std::allocator<std::unique_ptr<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3) <=
        (ulong)index) break;
    cmOrderDirectoriesConstraint::FindConflicts
              ((cmOrderDirectoriesConstraint *)
               puVar1[index]._M_t.
               super___uniq_ptr_impl<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>
               ._M_t,index);
    index = index + 1;
  }
  pvVar2 = &((this->ConflictGraph).
             super__Vector_base<cmOrderDirectories::ConflictList,_std::allocator<cmOrderDirectories::ConflictList>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super_vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>;
  for (this_00 = &((this->ConflictGraph).
                   super__Vector_base<cmOrderDirectories::ConflictList,_std::allocator<cmOrderDirectories::ConflictList>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                  super_vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>;
      this_00 != pvVar2; this_00 = this_00 + 1) {
    std::
    __sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_less_iter>
              ((this_00->
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
               _M_impl.super__Vector_impl_data._M_start,
               (this_00->
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
               _M_impl.super__Vector_impl_data._M_finish);
    __first = std::
              __unique<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<cmOrderDirectoriesCompare>>
                        ((this_00->
                         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                         )._M_impl.super__Vector_impl_data._M_start,
                         (this_00->
                         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish);
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::erase
              (this_00,(const_iterator)__first._M_current,
               (this_00->
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
               _M_impl.super__Vector_impl_data._M_finish);
  }
  FindImplicitConflicts(this);
  return;
}

Assistant:

void cmOrderDirectories::FindConflicts()
{
  // Allocate the conflict graph.
  this->ConflictGraph.resize(this->OriginalDirectories.size());
  this->DirectoryVisited.resize(this->OriginalDirectories.size(), 0);

  // Find directories conflicting with each entry.
  for (unsigned int i = 0; i < this->ConstraintEntries.size(); ++i) {
    this->ConstraintEntries[i]->FindConflicts(i);
  }

  // Clean up the conflict graph representation.
  for (ConflictList& cl : this->ConflictGraph) {
    // Sort the outgoing edges for each graph node so that the
    // original order will be preserved as much as possible.
    std::sort(cl.begin(), cl.end());

    // Make the edge list unique so cycle detection will be reliable.
    auto last = std::unique(cl.begin(), cl.end(), cmOrderDirectoriesCompare());
    cl.erase(last, cl.end());
  }

  // Check items in implicit link directories.
  this->FindImplicitConflicts();
}